

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O2

void __thiscall CVmObjLookupTable::apply_undo(CVmObjLookupTable *this,CVmUndoRecord *undo_rec)

{
  undefined4 *__ptr;
  char *pcVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  lookuptab_undo_rec *rec;
  
  __ptr = (undefined4 *)(undo_rec->id).ptrval;
  if (__ptr != (undefined4 *)0x0) {
    switch(*__ptr) {
    case 1:
      del_entry(this,(vm_val_t *)(__ptr + 2));
      break;
    case 2:
      add_entry(this,(vm_val_t *)(__ptr + 2),&undo_rec->oldval);
      break;
    case 3:
      mod_entry(this,(vm_val_t *)(__ptr + 2),&undo_rec->oldval);
      break;
    case 4:
      pcVar1 = (this->super_CVmObjCollection).super_CVmObject.ext_;
      aVar2 = (undo_rec->oldval).val;
      *(undefined8 *)(pcVar1 + 0x10) = *(undefined8 *)&undo_rec->oldval;
      *(anon_union_8_8_cb74652f_for_val *)(pcVar1 + 0x18) = aVar2;
    }
    free(__ptr);
    (undo_rec->id).ptrval = (void *)0x0;
  }
  return;
}

Assistant:

void CVmObjLookupTable::apply_undo(VMG_ struct CVmUndoRecord *undo_rec)
{
    if (undo_rec->id.ptrval != 0)
    {
        lookuptab_undo_rec *rec;

        /* get our private record from the standard undo record */
        rec = (lookuptab_undo_rec *)undo_rec->id.ptrval;
    
        /* check the action in the record */
        switch(rec->action)
        {
        case LOOKUPTAB_UNDO_NULL:
            /* 
             *   null record, which means that it had a weak reference to an
             *   object that has been deleted - there's no way to reinstate
             *   such records, so ignore it 
             */
            break;
            
        case LOOKUPTAB_UNDO_ADD:
            /* we added the entry, so we must now delete it */
            del_entry(vmg_ &rec->key);
            break;

        case LOOKUPTAB_UNDO_DEL:
            /* we deleted the entry, so we must now add it */
            add_entry(vmg_ &rec->key, &undo_rec->oldval);
            break;

        case LOOKUPTAB_UNDO_MOD:
            /* we modified the entry, so we must change it back */
            mod_entry(vmg_ &rec->key, &undo_rec->oldval);
            break;

        case LOOKUPTAB_UNDO_DEFVAL:
            /* we modified the default value; change it back */
            get_ext()->default_value = undo_rec->oldval;
            break;
        }

        /* discard the private record */
        t3free(rec);

        /* clear the pointer in the main record so we know it's gone */
        undo_rec->id.ptrval = 0;
    }
}